

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::assertionEnded(RunContext *this,AssertionResult *result)

{
  bool bVar1;
  OfType OVar2;
  TestCaseInfo *this_00;
  pointer pIVar3;
  AssertionStats local_110;
  AssertionResult *local_18;
  AssertionResult *result_local;
  RunContext *this_local;
  
  local_18 = result;
  result_local = (AssertionResult *)this;
  OVar2 = AssertionResult::getResultType(result);
  if (OVar2 == Ok) {
    (this->m_totals).assertions.passed = (this->m_totals).assertions.passed + 1;
    this->m_lastAssertionPassed = true;
  }
  else {
    bVar1 = AssertionResult::isOk(local_18);
    if (bVar1) {
      this->m_lastAssertionPassed = true;
    }
    else {
      this->m_lastAssertionPassed = false;
      this_00 = TestCase::getTestCaseInfo(this->m_activeTestCase);
      bVar1 = TestCaseInfo::okToFail(this_00);
      if (bVar1) {
        (this->m_totals).assertions.failedButOk = (this->m_totals).assertions.failedButOk + 1;
      }
      else {
        (this->m_totals).assertions.failed = (this->m_totals).assertions.failed + 1;
      }
    }
  }
  pIVar3 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  AssertionStats::AssertionStats(&local_110,local_18,&this->m_messages,&this->m_totals);
  (*pIVar3->_vptr_IStreamingReporter[10])(pIVar3,&local_110);
  AssertionStats::~AssertionStats(&local_110);
  resetAssertionInfo(this);
  Option<Catch::AssertionResult>::operator=(&this->m_lastResult,local_18);
  return;
}

Assistant:

void RunContext::assertionEnded(AssertionResult const & result) {
        if (result.getResultType() == ResultWas::Ok) {
            m_totals.assertions.passed++;
            m_lastAssertionPassed = true;
        } else if (!result.isOk()) {
            m_lastAssertionPassed = false;
            if( m_activeTestCase->getTestCaseInfo().okToFail() )
                m_totals.assertions.failedButOk++;
            else
                m_totals.assertions.failed++;
        }
        else {
            m_lastAssertionPassed = true;
        }

        // We have no use for the return value (whether messages should be cleared), because messages were made scoped
        // and should be let to clear themselves out.
        static_cast<void>(m_reporter->assertionEnded(AssertionStats(result, m_messages, m_totals)));

        // Reset working state
        resetAssertionInfo();
        m_lastResult = result;
    }